

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

uint __thiscall Graphics::CompileShaders(Graphics *this)

{
  GLenum GVar1;
  Exception *pEVar2;
  allocator<wchar_t> local_481;
  wstring local_480;
  undefined1 local_45a;
  allocator<wchar_t> local_459;
  wstring local_458;
  undefined1 local_432;
  allocator<wchar_t> local_431;
  wstring local_430;
  undefined1 local_40a;
  allocator<wchar_t> local_409;
  wstring local_408;
  undefined1 local_3e2;
  allocator<wchar_t> local_3e1;
  wstring local_3e0;
  undefined1 local_3ba;
  allocator<wchar_t> local_3b9;
  wstring local_3b8;
  undefined1 local_392;
  allocator<wchar_t> local_391;
  wstring local_390;
  GLuint local_370;
  undefined1 local_36a;
  allocator<wchar_t> local_369;
  uint shader_program;
  undefined1 local_342;
  allocator<wchar_t> local_341;
  wstring local_340;
  undefined1 local_31a;
  allocator<wchar_t> local_319;
  wstring local_318;
  undefined1 local_2f2;
  allocator<wchar_t> local_2f1;
  wstring local_2f0;
  GLuint local_2d0;
  undefined1 local_2ca;
  allocator<wchar_t> local_2c9;
  uint fragment_shader;
  GLchar local_2a8 [8];
  char infoLog [512];
  int local_a0;
  undefined1 local_9a;
  allocator<wchar_t> local_99;
  int success;
  undefined1 local_72;
  allocator<wchar_t> local_71;
  wstring local_70;
  undefined1 local_4d;
  allocator<wchar_t> local_39;
  wstring local_38;
  GLuint local_14;
  Graphics *pGStack_10;
  uint vertex_shader;
  Graphics *this_local;
  
  pGStack_10 = this;
  local_14 = (*glad_glCreateShader)(0x8b31);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_4d = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_38,L"glCreateShader of vertex shader failed",&local_39);
    Exception::Exception
              (pEVar2,&local_38,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xcb);
    local_4d = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glShaderSource)(local_14,1,&CompileShaders::vertex_shader_src,(GLint *)0x0);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_72 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_70,L"glShaderSource of vertex shader failed",&local_71);
    Exception::Exception
              (pEVar2,&local_70,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xd0);
    local_72 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glCompileShader)(local_14);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_9a = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&success,L"glCompileShader of vertex shader failed",&local_99);
    Exception::Exception
              (pEVar2,(wstring *)&success,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xd5);
    local_9a = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glGetShaderiv)(local_14,0x8b81,&local_a0);
  if (local_a0 == 0) {
    (*glad_glGetShaderInfoLog)(local_14,0x200,(GLsizei *)0x0,local_2a8);
    std::operator<<((ostream *)&std::cerr,local_2a8);
    local_2ca = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&fragment_shader,L"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n",&local_2c9
              );
    Exception::Exception
              (pEVar2,(wstring *)&fragment_shader,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xde);
    local_2ca = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  local_2d0 = (*glad_glCreateShader)(0x8b30);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_2f2 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_2f0,L"glCreateShader of fragment shader failed",&local_2f1);
    Exception::Exception
              (pEVar2,&local_2f0,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xe5);
    local_2f2 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glShaderSource)(local_2d0,1,&CompileShaders::fragment_shader_src,(GLint *)0x0);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_31a = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_318,L"glShaderSource of fragment shader failed",&local_319);
    Exception::Exception
              (pEVar2,&local_318,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xea);
    local_31a = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glCompileShader)(local_2d0);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_342 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_340,L"glCompileShader of fragment shader failed",&local_341);
    Exception::Exception
              (pEVar2,&local_340,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xef);
    local_342 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glGetShaderiv)(local_2d0,0x8b81,&local_a0);
  if (local_a0 == 0) {
    (*glad_glGetShaderInfoLog)(local_2d0,0x200,(GLsizei *)0x0,local_2a8);
    std::operator<<((ostream *)&std::cerr,local_2a8);
    local_36a = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&shader_program,L"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n",
               &local_369);
    Exception::Exception
              (pEVar2,(wstring *)&shader_program,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xf6);
    local_36a = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  local_370 = (*glad_glCreateProgram)();
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_392 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_390,L"glCreateProgram failed",&local_391);
    Exception::Exception
              (pEVar2,&local_390,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0xfc);
    local_392 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glAttachShader)(local_370,local_14);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_3ba = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_3b8,L"glAttachShader of vertex shader failed",&local_3b9);
    Exception::Exception
              (pEVar2,&local_3b8,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x101);
    local_3ba = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glAttachShader)(local_370,local_2d0);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_3e2 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_3e0,L"glAttachShader of fragment shader failed",&local_3e1);
    Exception::Exception
              (pEVar2,&local_3e0,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x106);
    local_3e2 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glLinkProgram)(local_370);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_40a = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_408,L"glLinkProgram failed",&local_409);
    Exception::Exception
              (pEVar2,&local_408,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x10b);
    local_40a = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glGetProgramiv)(local_370,0x8b82,&local_a0);
  if (local_a0 == 0) {
    (*glad_glGetProgramInfoLog)(local_370,0x200,(GLsizei *)0x0,local_2a8);
    std::operator<<((ostream *)&std::cerr,local_2a8);
    local_432 = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_430,L"ERROR::PROGRAM::LINK_FAILED\n",&local_431);
    Exception::Exception
              (pEVar2,&local_430,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x112);
    local_432 = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glDeleteShader)(local_14);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    local_45a = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_458,L"glDeleteShader of vertex shader failed",&local_459);
    Exception::Exception
              (pEVar2,&local_458,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x118);
    local_45a = 0;
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  (*glad_glDeleteShader)(local_2d0);
  GVar1 = (*glad_glGetError)();
  if (GVar1 != 0) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x50);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_480,L"glDeleteShader of fragment shader failed",&local_481);
    Exception::Exception
              (pEVar2,&local_480,
               L"/workspace/llm4binary/github/license_all_cmakelists_25/FinalL[P]chili_framework/Engine/Graphics.cpp"
               ,0x11d);
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  return local_370;
}

Assistant:

unsigned int Graphics::CompileShaders()
{
    static constexpr const char* vertex_shader_src = R"shader(#version 330 core
layout(location = 0) in vec2 aPos;
layout(location = 1) in vec2 aTexCoord;

out vec2 TexCoord;

void main()
{
    gl_Position = vec4(aPos.x, aPos.y, 0.0, 1.0);
    TexCoord = aTexCoord;
})shader";
    static constexpr const char* fragment_shader_src = R"shader(#version 330 core
in vec2 TexCoord;

out vec4 FragColor;

uniform sampler2D ourTexture;

void main()
{
    FragColor = texture(ourTexture, TexCoord);
})shader";

    unsigned int vertex_shader;
    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateShader of vertex shader failed");
    }
    glShaderSource(vertex_shader, 1, &vertex_shader_src, NULL);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glShaderSource of vertex shader failed");
    }
    glCompileShader(vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCompileShader of vertex shader failed");
    }
    int  success;
    char infoLog[512];
    glGetShaderiv(vertex_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(vertex_shader, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::SHADER::VERTEX::COMPILATION_FAILED\n");
    }

    unsigned int fragment_shader;
    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateShader of fragment shader failed");
    }
    glShaderSource(fragment_shader, 1, &fragment_shader_src, NULL);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glShaderSource of fragment shader failed");
    }
    glCompileShader(fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCompileShader of fragment shader failed");
    }
    glGetShaderiv(fragment_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(fragment_shader, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::SHADER::FRAGMENT::COMPILATION_FAILED\n");
    }

    unsigned int shader_program = glCreateProgram();
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glCreateProgram failed");
    }
    glAttachShader(shader_program, vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glAttachShader of vertex shader failed");
    }
    glAttachShader(shader_program, fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glAttachShader of fragment shader failed");
    }
    glLinkProgram(shader_program);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glLinkProgram failed");
    }
    glGetProgramiv(shader_program, GL_LINK_STATUS, &success);
    if (!success)
    {
        glGetProgramInfoLog(shader_program, 512, NULL, infoLog);
        std::cerr << infoLog;
        throw CHILI_GFX_EXCEPTION(L"ERROR::PROGRAM::LINK_FAILED\n");
    }

    glDeleteShader(vertex_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glDeleteShader of vertex shader failed");
    }
    glDeleteShader(fragment_shader);
    if (glGetError() != GL_NO_ERROR)
    {
        throw CHILI_GFX_EXCEPTION(L"glDeleteShader of fragment shader failed");
    }

    return shader_program;
}